

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindLeastGreatest<duckdb::GreaterOp>
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  optional_idx error_location;
  bool bVar1;
  reference pvVar2;
  type pEVar3;
  ParameterNotResolvedException *this_00;
  reference this_01;
  BinderException *this_02;
  pointer pEVar4;
  code *__f;
  ulong __n;
  allocator local_c9;
  LogicalType child_type;
  string local_a8;
  LogicalType arg_type;
  string local_70;
  string local_50;
  
  pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (pvVar2);
  ExpressionBinder::GetExpressionReturnType(&child_type,pEVar3);
  for (__n = 1; __n < (ulong)((long)(arguments->
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(arguments->
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1)
  {
    pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,__n);
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(pvVar2);
    ExpressionBinder::GetExpressionReturnType(&arg_type,pEVar3);
    bVar1 = LogicalType::TryGetMaxLogicalType(context,&child_type,&arg_type,&child_type);
    if (!bVar1) {
      this_02 = (BinderException *)__cxa_allocate_exception(0x10);
      pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(arguments,__n);
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar2);
      error_location.index = (pEVar4->super_BaseExpression).query_location.index;
      ::std::__cxx11::string::string
                ((string *)&local_a8,
                 "Cannot combine types of %s and %s - an explicit cast is required",&local_c9);
      LogicalType::ToString_abi_cxx11_(&local_50,&child_type);
      LogicalType::ToString_abi_cxx11_(&local_70,&arg_type);
      BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                (this_02,error_location,&local_a8,&local_50,&local_70);
      __cxa_throw(this_02,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    LogicalType::~LogicalType(&arg_type);
  }
  if (child_type.id_ == STRING_LITERAL) {
    LogicalType::LogicalType((LogicalType *)&local_a8,VARCHAR);
LAB_00cd62a1:
    LogicalType::operator=(&child_type,(LogicalType *)&local_a8);
    LogicalType::~LogicalType((LogicalType *)&local_a8);
  }
  else {
    if (child_type.id_ == INTEGER_LITERAL) {
      IntegerLiteral::GetType((LogicalType *)&local_a8,&child_type);
      goto LAB_00cd62a1;
    }
    if (child_type.id_ == UNKNOWN) {
      this_00 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
      ParameterNotResolvedException::ParameterNotResolvedException(this_00);
      __cxa_throw(this_00,&ParameterNotResolvedException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
  }
  switch(child_type.physical_type_) {
  case BOOL:
  case INT8:
    __f = 
    LeastGreatestFunction<signed_char,duckdb::GreaterThan,duckdb::StandardLeastGreatest<false>>;
    break;
  case UINT8:
  case UINT16:
  case UINT32:
  case UINT64:
  case UINT64|UINT8:
  case FLOAT:
switchD_00cd62d6_caseD_2:
    ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
               &bound_function->function,
               LeastGreatestFunction<duckdb::string_t,duckdb::GreaterThan,duckdb::SortKeyLeastGreatest>
              );
    bound_function->init_local_state = LeastGreatestSortKeyInit<duckdb::GreaterOp>;
    goto LAB_00cd637f;
  case INT16:
    __f = LeastGreatestFunction<short,duckdb::GreaterThan,duckdb::StandardLeastGreatest<false>>;
    break;
  case INT32:
    __f = LeastGreatestFunction<int,duckdb::GreaterThan,duckdb::StandardLeastGreatest<false>>;
    break;
  case INT64:
    __f = LeastGreatestFunction<long,duckdb::GreaterThan,duckdb::StandardLeastGreatest<false>>;
    break;
  case DOUBLE:
    __f = LeastGreatestFunction<double,duckdb::GreaterThan,duckdb::StandardLeastGreatest<false>>;
    break;
  default:
    if (child_type.physical_type_ == VARCHAR) {
      __f = 
      LeastGreatestFunction<duckdb::string_t,duckdb::GreaterThan,duckdb::StandardLeastGreatest<true>>
      ;
    }
    else {
      if (child_type.physical_type_ != INT128) goto switchD_00cd62d6_caseD_2;
      __f = 
      LeastGreatestFunction<duckdb::hugeint_t,duckdb::GreaterThan,duckdb::StandardLeastGreatest<false>>
      ;
    }
  }
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
            ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
             &bound_function->function,__f);
LAB_00cd637f:
  this_01 = vector<duckdb::LogicalType,_true>::get<true>
                      (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments,0)
  ;
  LogicalType::operator=(this_01,&child_type);
  LogicalType::operator=
            (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.varargs,&child_type);
  LogicalType::operator=(&(bound_function->super_BaseScalarFunction).return_type,&child_type);
  *(undefined8 *)this = 0;
  LogicalType::~LogicalType(&child_type);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> BindLeastGreatest(ClientContext &context, ScalarFunction &bound_function,
                                           vector<unique_ptr<Expression>> &arguments) {
	LogicalType child_type = ExpressionBinder::GetExpressionReturnType(*arguments[0]);
	for (idx_t i = 1; i < arguments.size(); i++) {
		auto arg_type = ExpressionBinder::GetExpressionReturnType(*arguments[i]);
		if (!LogicalType::TryGetMaxLogicalType(context, child_type, arg_type, child_type)) {
			throw BinderException(arguments[i]->GetQueryLocation(),
			                      "Cannot combine types of %s and %s - an explicit cast is required",
			                      child_type.ToString(), arg_type.ToString());
		}
	}
	switch (child_type.id()) {
	case LogicalTypeId::UNKNOWN:
		throw ParameterNotResolvedException();
	case LogicalTypeId::INTEGER_LITERAL:
		child_type = IntegerLiteral::GetType(child_type);
		break;
	case LogicalTypeId::STRING_LITERAL:
		child_type = LogicalType::VARCHAR;
		break;
	default:
		break;
	}
	using OP = typename LEAST_GREATER_OP::OP;
	switch (child_type.InternalType()) {
#ifndef DUCKDB_SMALLER_BINARY
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		bound_function.function = LeastGreatestFunction<int8_t, OP>;
		break;
	case PhysicalType::INT16:
		bound_function.function = LeastGreatestFunction<int16_t, OP>;
		break;
	case PhysicalType::INT32:
		bound_function.function = LeastGreatestFunction<int32_t, OP>;
		break;
	case PhysicalType::INT64:
		bound_function.function = LeastGreatestFunction<int64_t, OP>;
		break;
	case PhysicalType::INT128:
		bound_function.function = LeastGreatestFunction<hugeint_t, OP>;
		break;
	case PhysicalType::DOUBLE:
		bound_function.function = LeastGreatestFunction<double, OP>;
		break;
	case PhysicalType::VARCHAR:
		bound_function.function = LeastGreatestFunction<string_t, OP, StandardLeastGreatest<true>>;
		break;
#endif
	default:
		// fallback with sort keys
		bound_function.function = LeastGreatestFunction<string_t, OP, SortKeyLeastGreatest>;
		bound_function.init_local_state = LeastGreatestSortKeyInit<LEAST_GREATER_OP>;
		break;
	}
	bound_function.arguments[0] = child_type;
	bound_function.varargs = child_type;
	bound_function.return_type = child_type;
	return nullptr;
}